

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O3

ptrdiff_t __thiscall
soplex::
ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
::reMax(ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        *this,int newMax,int newSize)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *pNVar1;
  long lVar2;
  int n;
  uint uVar3;
  ulong uVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *pNVar5;
  long lVar6;
  ulong uVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *pNVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *newMem;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_48;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_40;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_38;
  
  if (newSize < 0) {
    newSize = this->thesize;
  }
  if (newMax <= newSize) {
    newMax = newSize;
  }
  uVar4 = 1;
  if (1 < newMax) {
    uVar4 = (ulong)(uint)newMax;
  }
  n = (int)uVar4;
  if (n == this->themax) {
    this->thesize = newSize;
    return 0;
  }
  local_48 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              *)0x0;
  spx_alloc<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>*>
            (&local_48,n);
  uVar7 = 0;
  if ((0 < newSize) && (0 < this->thesize)) {
    local_40 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)CONCAT44(local_40._4_4_,n);
    local_38 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)CONCAT44(local_38._4_4_,newSize);
    lVar6 = 0;
    uVar7 = 0;
    do {
      pNVar1 = local_48;
      pNVar5 = this->data;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)((long)&(local_48->val).m_backend.m_value.num.m_backend.
                                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                    .m_data + lVar6),
                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)((long)&(pNVar5->val).m_backend.m_value.num.m_backend.
                                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                    .m_data + lVar6));
      *(undefined4 *)((long)&pNVar1->idx + lVar6) = *(undefined4 *)((long)&pNVar5->idx + lVar6);
      uVar7 = uVar7 + 1;
      if ((uint)newSize <= uVar7) break;
      lVar6 = lVar6 + 0x50;
    } while ((long)uVar7 < (long)this->thesize);
    uVar4 = (ulong)local_40 & 0xffffffff;
    newSize = (uint)local_38;
    uVar3 = (uint)local_40;
    if ((uint)local_40 <= (uint)uVar7) goto LAB_0019b59d;
  }
  uVar3 = (uint)uVar4;
  lVar2 = uVar7 * 0x50 + 0x40;
  lVar6 = uVar4 - uVar7;
  do {
    *(undefined8 *)((long)local_48 + lVar2 + -0x40) = 0;
    *(undefined4 *)((long)local_48 + lVar2 + -0x30) = 1;
    *(undefined2 *)((long)local_48 + lVar2 + -0x2c) = 0x100;
    *(undefined1 *)((long)local_48 + lVar2 + -0x2a) = 0;
    *(undefined8 *)((long)local_48 + lVar2 + -0x20) = 1;
    *(undefined4 *)((long)local_48 + lVar2 + -0x10) = 1;
    *(undefined2 *)((long)local_48 + lVar2 + -0xc) = 0x100;
    *(undefined1 *)((long)local_48 + lVar2 + -10) = 0;
    *(undefined4 *)
     ((long)&(local_48->val).m_backend.m_value.num.m_backend.
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_data + lVar2) = 0;
    lVar2 = lVar2 + 0x50;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
LAB_0019b59d:
  pNVar5 = this->data;
  lVar6 = (long)this->themax;
  pNVar1 = pNVar5;
  pNVar8 = local_48;
  if (0 < lVar6) {
    local_38 = local_48;
    uVar4 = lVar6 + 1;
    lVar6 = lVar6 * 0x50 + -0x1a;
    local_40 = pNVar5;
    do {
      pNVar5 = this->data;
      if ((*(char *)((long)pNVar5 + lVar6 + -1) == '\0') &&
         (*(char *)((long)&(pNVar5->val).m_backend.m_value.num.m_backend.
                           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                           .m_data + lVar6) == '\0')) {
        operator_delete(*(void **)((long)pNVar5 + lVar6 + -0xe),
                        (ulong)*(uint *)((long)pNVar5 + lVar6 + -0x16) << 3);
      }
      if ((*(char *)((long)pNVar5 + lVar6 + -0x21) == '\0') &&
         (*(char *)((long)pNVar5 + lVar6 + -0x20) == '\0')) {
        operator_delete(*(void **)((long)pNVar5 + lVar6 + -0x2e),
                        (ulong)*(uint *)((long)pNVar5 + lVar6 + -0x36) << 3);
      }
      uVar4 = uVar4 - 1;
      lVar6 = lVar6 + -0x50;
    } while (1 < uVar4);
    pNVar5 = this->data;
    pNVar1 = local_40;
    pNVar8 = local_38;
  }
  free(pNVar5);
  this->data = local_48;
  this->themax = uVar3;
  this->thesize = newSize;
  return (long)pNVar8 - (long)pNVar1;
}

Assistant:

ptrdiff_t reMax(int newMax = 1, int newSize = -1)
   {
      /* process input */
      if(newSize < 0)
         newSize = size();

      if(newMax < 1)
         newMax = 1;

      if(newMax < newSize)
         newMax = newSize;

      /* nothing to reallocate */
      if(newMax == themax)
      {
         thesize = newSize;
         return 0;
      }

      /* allocate new memory */
      T* newMem = nullptr;
      spx_alloc(newMem, newMax);

      /* call copy constructor for first elements */
      int i;

      for(i = 0; i < size() && i < newSize; i++)
         new(&(newMem[i])) T(data[i]);

      /* call default constructor for remaining elements */
      for(; i < newMax; i++)
         new(&(newMem[i])) T();

      /* compute pointer difference */
      ptrdiff_t pshift = reinterpret_cast<char*>(newMem) - reinterpret_cast<char*>(data);

      /* free old memory */
      for(i = themax - 1; i >= 0; i--)
         data[i].~T();

      spx_free(data);

      /* assign new memory */
      data = newMem;
      themax = newMax;
      thesize = newSize;

      return pshift;
   }